

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curramt.cpp
# Opt level: O3

void __thiscall
icu_63::CurrencyAmount::CurrencyAmount
          (CurrencyAmount *this,double amount,ConstChar16Ptr *isoCode,UErrorCode *ec)

{
  MeasureUnit *adoptedUnit;
  ConstChar16Ptr *size;
  ConstChar16Ptr local_b0;
  char16_t *local_a8;
  Formattable local_90;
  
  size = isoCode;
  Formattable::Formattable(&local_90,amount);
  adoptedUnit = (MeasureUnit *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
  if (adoptedUnit != (MeasureUnit *)0x0) {
    local_b0 = (ConstChar16Ptr)isoCode->p_;
    CurrencyUnit::CurrencyUnit((CurrencyUnit *)adoptedUnit,&local_b0,ec);
  }
  Measure::Measure(&this->super_Measure,&local_90,adoptedUnit,ec);
  if (adoptedUnit != (MeasureUnit *)0x0) {
    local_a8 = local_b0.p_;
  }
  Formattable::~Formattable(&local_90);
  (this->super_Measure).super_UObject._vptr_UObject = (_func_int **)&PTR__CurrencyAmount_00478d20;
  return;
}

Assistant:

CurrencyAmount::CurrencyAmount(double amount, ConstChar16Ptr isoCode,
                               UErrorCode& ec) :
    Measure(Formattable(amount), new CurrencyUnit(isoCode, ec), ec) {
}